

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32
png_get_sCAL_fixed(png_const_structrp png_ptr,png_const_inforp info_ptr,int *unit,
                  png_fixed_point *width,png_fixed_point *height)

{
  png_fixed_point pVar1;
  png_uint_32 pVar2;
  double dVar3;
  
  pVar2 = 0;
  if ((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
     (pVar2 = 0, (info_ptr->valid & 0x4000) != 0)) {
    *unit = (uint)info_ptr->scal_unit;
    dVar3 = atof(info_ptr->scal_s_width);
    pVar1 = png_fixed(png_ptr,dVar3,"sCAL width");
    *width = pVar1;
    dVar3 = atof(info_ptr->scal_s_height);
    pVar1 = png_fixed(png_ptr,dVar3,"sCAL height");
    *height = pVar1;
    pVar2 = 0x4000;
  }
  return pVar2;
}

Assistant:

png_uint_32 PNGAPI
png_get_sCAL_fixed(png_const_structrp png_ptr, png_const_inforp info_ptr,
    int *unit, png_fixed_point *width, png_fixed_point *height)
{
   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_sCAL) != 0)
   {
      *unit = info_ptr->scal_unit;
      /*TODO: make this work without FP support; the API is currently eliminated
       * if neither floating point APIs nor internal floating point arithmetic
       * are enabled.
       */
      *width = png_fixed(png_ptr, atof(info_ptr->scal_s_width), "sCAL width");
      *height = png_fixed(png_ptr, atof(info_ptr->scal_s_height),
          "sCAL height");
      return (PNG_INFO_sCAL);
   }

   return(0);
}